

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

int Eso_ManFindDistOneLitEqual(int *pCube1,int *pCube2,int nLits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (nLits < 1) {
    iVar3 = -1;
  }
  else {
    iVar3 = -1;
    uVar4 = 0;
    do {
      uVar1 = pCube1[uVar4];
      uVar2 = pCube2[uVar4];
      if (uVar1 != uVar2) {
        if (iVar3 != -1) {
          return -1;
        }
        if (((int)uVar1 < 0) || ((int)uVar2 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (1 < (uVar2 ^ uVar1)) {
          return -1;
        }
        iVar3 = (int)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nLits != uVar4);
  }
  return iVar3;
}

Assistant:

int Eso_ManFindDistOneLitEqual( int * pCube1, int * pCube2, int nLits ) // pCube1 and pCube2 both have nLits
{
    int i, iDiff = -1;
    for ( i = 0; i < nLits; i++ )
        if ( pCube1[i] != pCube2[i] )
        {
            if ( iDiff != -1 )
                return -1;
            if ( Abc_Lit2Var(pCube1[i]) != Abc_Lit2Var(pCube2[i]) )
                return -1;
            iDiff = i;
        }
    return iDiff;
}